

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbest_generator.cpp
# Opt level: O0

bool __thiscall MeCab::NBestGenerator::next(NBestGenerator *this)

{
  bool bVar1;
  const_reference ppQVar2;
  QueueElement *pQVar3;
  QueueElement *n_1;
  Path *path;
  QueueElement *n;
  Node *rnode;
  QueueElement *top;
  priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
  *in_stack_ffffffffffffffd0;
  FreeList<MeCab::NBestGenerator::QueueElement> *this_00;
  value_type *in_stack_ffffffffffffffd8;
  QueueElement *pQVar4;
  Node *this_01;
  
  while( true ) {
    bVar1 = std::
            priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
            ::empty((priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
                     *)0x179221);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    ppQVar2 = std::
              priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
              ::top((priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
                     *)0x17923a);
    pQVar4 = *ppQVar2;
    std::
    priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
    ::pop(in_stack_ffffffffffffffd0);
    this_01 = pQVar4->node;
    if (this_01->stat == '\x02') break;
    for (this_00 = (FreeList<MeCab::NBestGenerator::QueueElement> *)this_01->lpath;
        this_00 != (FreeList<MeCab::NBestGenerator::QueueElement> *)0x0;
        this_00 = (FreeList<MeCab::NBestGenerator::QueueElement> *)
                  (this_00->freeList).
                  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pQVar3 = FreeList<MeCab::NBestGenerator::QueueElement>::alloc(this_00);
      pQVar3->node = (Node *)(this_00->freeList).
                             super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
      pQVar3->gx = (long)(int)this_00->pi_ + pQVar4->gx;
      pQVar3->fx = (long)&(this_00->freeList).
                          super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish[0xd]->node +
                   pQVar4->gx + (long)(int)this_00->pi_;
      pQVar3->next = pQVar4;
      std::
      priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
      ::push((priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
              *)this_01,in_stack_ffffffffffffffd8);
    }
    in_stack_ffffffffffffffd0 =
         (priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
          *)0x0;
  }
  for (; pQVar4->next != (QueueElement *)0x0; pQVar4 = pQVar4->next) {
    pQVar4->node->next = pQVar4->next->node;
    pQVar4->next->node->prev = pQVar4->node;
  }
  return true;
}

Assistant:

bool NBestGenerator::next() {
  while (!agenda_.empty()) {
    QueueElement *top = agenda_.top();
    agenda_.pop();
    Node *rnode = top->node;

    if (rnode->stat == MECAB_BOS_NODE) {  // BOS
      for (QueueElement *n = top; n->next; n = n->next) {
        n->node->next = n->next->node;   // change next & prev
        n->next->node->prev = n->node;
        // TODO: rewrite costs;
      }
      return true;
    }

    for (Path *path = rnode->lpath; path; path = path->lnext) {
      QueueElement *n = freelist_.alloc();
      n->node = path->lnode;
      n->gx = path->cost + top->gx;
      n->fx = path->lnode->cost + path->cost + top->gx;
      n->next = top;
      agenda_.push(n);
    }
  }

  return false;
}